

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

solution_t *
find_solution(solution_t *__return_storage_ptr__,map_t *m,nodes_list_t *nodes,int bombs,int rounds)

{
  size_t *this;
  node_t *n;
  bool bVar1;
  size_t *psVar2;
  list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *plVar3;
  pointer *__return_storage_ptr___00;
  seen_t *psVar4;
  _List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_108;
  undefined1 local_f0 [8];
  map_t m2;
  flags_map_t flags;
  nodes_list_t pt;
  nodes_list_t n2;
  undefined1 local_80 [8];
  solution_t result;
  solution_t r;
  bool local_32;
  bool local_31;
  bool empty;
  
  local_80 = (undefined1  [8])local_80;
  result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)local_80;
  if (bombs == 0) {
    if ((rounds != 0) &&
       ((nodes->super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
        _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)nodes))
    goto LAB_00105abe;
  }
  else if (rounds != 0) {
LAB_00105abe:
    plVar3 = &solutions_abi_cxx11_;
    psVar4 = &seen_abi_cxx11_;
    do {
      psVar4 = (seen_t *)
               (psVar4->
               super__List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (psVar4 == &seen_abi_cxx11_) {
        build_flags_map((flags_map_t *)
                        &m2.
                         super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,m,nodes,&local_32);
        __return_storage_ptr___00 =
             &flags.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        get_possible_turns_abi_cxx11_
                  ((nodes_list_t *)__return_storage_ptr___00,
                   (flags_map_t *)
                   &m2.
                    super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_31 = 1 < rounds && 1 < bombs;
        this = &result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl._M_node._M_size;
        goto LAB_00105b7f;
      }
      plVar3 = (list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                *)(((_List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     *)&((_List_node_base *)plVar3)->_M_next)->_M_impl)._M_node.
                  super__List_node_base._M_next;
      bVar1 = std::operator==((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              ((long)psVar4 + 0x10),nodes);
    } while (!bVar1);
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
              (__return_storage_ptr__,
               (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               ((long)plVar3 + 0x10));
    goto LAB_00105cfb;
  }
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)__return_storage_ptr__,(_List_node_header *)local_80);
LAB_00105cfb:
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_80);
  return __return_storage_ptr__;
LAB_00105b7f:
  __return_storage_ptr___00 = (pointer *)*__return_storage_ptr___00;
  if (__return_storage_ptr___00 ==
      &flags.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00105cb3;
  result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  _M_node._M_size = (size_t)this;
  std::
  vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
  ::vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
            *)local_f0,m);
  n = (node_t *)(__return_storage_ptr___00 + 2);
  explode((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
           *)local_f0,n);
  psVar2 = &pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            _M_node._M_size;
  get_nodes_abi_cxx11_
            ((nodes_list_t *)psVar2,
             (vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
              *)local_f0);
  if ((size_t *)
      pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      _M_node._M_size == psVar2) {
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl._M_node._M_size,n);
LAB_00105c85:
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
              ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_80,
               (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl._M_node._M_size);
    std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
              ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl._M_node._M_size);
    std::
    vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
    ::~vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
               *)local_f0);
    std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
              ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               &result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl._M_node._M_size);
    goto LAB_00105cb3;
  }
  if (local_31 != false) {
    find_solution((solution_t *)&local_108,
                  (vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                   *)local_f0,(nodes_list_t *)psVar2,bombs + -1,rounds + -1);
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_move_assign
              ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this,&local_108);
    std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
              (&local_108);
    psVar2 = this;
    if ((size_t *)
        result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node._M_size != this) {
      std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_front
                ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this,n);
      psVar2 = (size_t *)
               result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl._M_node._M_size;
    }
    if ((psVar2 != this && local_80 == (undefined1  [8])local_80) ||
       ((psVar2 != this &&
        (result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
         ._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0)))) goto LAB_00105c85;
  }
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl._M_node._M_size);
  std::
  vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
  ::~vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
             *)local_f0);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this);
  goto LAB_00105b7f;
LAB_00105cb3:
  std::__cxx11::
  list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::push_back(&seen_abi_cxx11_,nodes);
  std::__cxx11::
  list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::push_back(&solutions_abi_cxx11_,(value_type *)local_80);
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)__return_storage_ptr__,(_List_node_header *)local_80);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            ((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &flags.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&m2.
                super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  goto LAB_00105cfb;
}

Assistant:

solution_t find_solution(const map_t& m, nodes_list_t& nodes, int bombs, int rounds)
{
    bool empty;
    solution_t result;

    if ((0 == bombs && !nodes.empty())
        || 0 == rounds)
    {
        return result;
    }

    std::list<solution_t>::const_iterator j = solutions.begin();
    for (seen_t::const_iterator i = seen.begin(); i != seen.end(); i++, j++)
    {
        if (*i == nodes)
        {
            return *j;
        }
    }

    //std::cerr << "try solve: " << std::endl;
    //dump_map(m);

    flags_map_t flags = build_flags_map(m, nodes, empty);
    nodes_list_t pt = get_possible_turns(flags);
    //std::cerr << bombs << " " << std::endl;

    for (nodes_list_t::const_iterator i = pt.begin(); i != pt.end(); i++)
    {
        solution_t r;
        map_t m2 = m;
        explode(m2, *i);
        nodes_list_t n2 = get_nodes(m2);

        //std::cerr << bombs - 1 << " " << rounds - 1 << " ";
        //dump_nodes(n2);
        if (n2.empty())
        {
            r.push_back(*i);
            result = r;
            break;
        } else if (0 < bombs - 1 && 0 < rounds - 1)
        {
            r = find_solution(m2, n2, bombs - 1, rounds - 1);
            if (!r.empty())
            {
                r.push_front(*i);
            }
            if ((result.empty() && !r.empty()) || (!r.empty() && result.size() > r.size()))
            {
                result = r;
                break;
            }
        }
    }

    seen.push_back(nodes);
    solutions.push_back(result);
    return result;
}